

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateActivation
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  NonlinearityTypeCase NVar3;
  ActivationParams *pAVar4;
  allocator<char> local_d9;
  string local_d8;
  byte local_b2;
  allocator<char> local_b1;
  string local_b0;
  byte local_8a;
  allocator<char> local_89;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar2;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_38 == 0) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        pAVar4 = Specification::NeuralNetworkLayer::activation(local_20);
        NVar3 = Specification::ActivationParams::NonlinearityType_case(pAVar4);
        pNVar1 = local_20;
        if (NVar3 == kPReLU) {
          local_3a = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_60,"ActivationPReLU",&local_61);
          validateInputOutputRankEquality
                    (__return_storage_ptr__,pNVar1,&local_60,&this->blobNameToRank);
          std::__cxx11::string::~string((string *)&local_60);
          std::allocator<char>::~allocator(&local_61);
          bVar2 = Result::good(__return_storage_ptr__);
          if (!bVar2) {
            local_3a = 1;
          }
          local_38 = (uint)!bVar2;
          if ((local_3a & 1) == 0) {
            Result::~Result(__return_storage_ptr__);
          }
          pNVar1 = local_20;
          if (local_38 != 0) {
            return __return_storage_ptr__;
          }
          local_62 = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,"ActivationPReLU",&local_89);
          validateRankCount(__return_storage_ptr__,pNVar1,&local_88,3,-1,&this->blobNameToRank);
          std::__cxx11::string::~string((string *)&local_88);
          std::allocator<char>::~allocator(&local_89);
          bVar2 = Result::good(__return_storage_ptr__);
          if (!bVar2) {
            local_62 = 1;
          }
          local_38 = (uint)!bVar2;
          if ((local_62 & 1) == 0) {
            Result::~Result(__return_storage_ptr__);
          }
          if (local_38 != 0) {
            return __return_storage_ptr__;
          }
        }
        pAVar4 = Specification::NeuralNetworkLayer::activation(local_20);
        NVar3 = Specification::ActivationParams::NonlinearityType_case(pAVar4);
        pNVar1 = local_20;
        if (NVar3 == kParametricSoftplus) {
          local_8a = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,"ActivationParametricSoftplus",&local_b1);
          validateInputOutputRankEquality
                    (__return_storage_ptr__,pNVar1,&local_b0,&this->blobNameToRank);
          std::__cxx11::string::~string((string *)&local_b0);
          std::allocator<char>::~allocator(&local_b1);
          bVar2 = Result::good(__return_storage_ptr__);
          if (!bVar2) {
            local_8a = 1;
          }
          local_38 = (uint)!bVar2;
          if ((local_8a & 1) == 0) {
            Result::~Result(__return_storage_ptr__);
          }
          pNVar1 = local_20;
          if (local_38 != 0) {
            return __return_storage_ptr__;
          }
          local_b2 = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"ActivationParametricSoftplus",&local_d9);
          validateRankCount(__return_storage_ptr__,pNVar1,&local_d8,3,-1,&this->blobNameToRank);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator(&local_d9);
          bVar2 = Result::good(__return_storage_ptr__);
          if (!bVar2) {
            local_b2 = 1;
          }
          local_38 = (uint)!bVar2;
          if ((local_b2 & 1) == 0) {
            Result::~Result(__return_storage_ptr__);
          }
          if (local_38 != 0) {
            return __return_storage_ptr__;
          }
        }
      }
      pAVar4 = Specification::NeuralNetworkLayer::activation(local_20);
      validateActivationParams(__return_storage_ptr__,pAVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateActivation(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kPReLU) {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ActivationPReLU", blobNameToRank));
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "ActivationPReLU", 3, -1, blobNameToRank));
        }

        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus) {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ActivationParametricSoftplus", blobNameToRank));
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "ActivationParametricSoftplus", 3, -1, blobNameToRank));
        }
    }

    return validateActivationParams(layer.activation());
}